

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

MetaCommandResult runCommand(string *input,Table *t)

{
  bool bVar1;
  ostream *poVar2;
  MetaCommandResult MVar3;
  
  bVar1 = std::operator==(input,".exit");
  if (!bVar1) {
    bVar1 = std::operator==(input,".constants");
    if (bVar1) {
      print_constants();
      MVar3 = CommandSuccess;
    }
    else {
      bVar1 = std::operator==(input,".btree");
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Tree: ");
        std::endl<char,std::char_traits<char>>(poVar2);
        MVar3 = CommandSuccess;
        Table::print(t,0,0);
      }
      else {
        MVar3 = CommandUnrecognized;
      }
    }
    return MVar3;
  }
  Table::dbClose(t);
  Table::~Table(t);
  operator_delete(t,0x10);
  exit(0);
}

Assistant:

MetaCommandResult runCommand(std::string input, Table *t) {
	if (input == ".exit") {
		t->dbClose();
		delete t;
		exit(EXIT_SUCCESS);
	} else if(input == ".constants") {
		print_constants();
		return MetaCommandResult::CommandSuccess;
	} else if (input == ".btree") {
		std::cout<<"Tree: " << std::endl;
		t->print(0, 0);
		return MetaCommandResult::CommandSuccess;
	} else {
		return MetaCommandResult::CommandUnrecognized;
	}
}